

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nsf_Emu.cpp
# Opt level: O2

void __thiscall Nsf_Emu::cpu_write_misc(Nsf_Emu *this,nes_addr_t addr,int data)

{
  Nes_Namco_Apu *this_00;
  state_t *psVar1;
  Nes_Fme7_Apu *this_01;
  
  this_00 = this->namco;
  if (this_00 != (Nes_Namco_Apu *)0x0) {
    if (addr == 0xf800) {
      this_00->addr_reg = data;
      return;
    }
    if (addr == 0x4800) {
      psVar1 = (this->super_Nes_Cpu).state;
      Nes_Namco_Apu::write_data(this_00,psVar1->base + psVar1->time,data);
      return;
    }
  }
  if ((0xbfff < addr) && (this_01 = this->fme7, this_01 != (Nes_Fme7_Apu *)0x0)) {
    if ((~addr & 0xe000) == 0) {
      psVar1 = (this->super_Nes_Cpu).state;
      Nes_Fme7_Apu::write_data(this_01,psVar1->base + psVar1->time,data);
      return;
    }
    if ((addr & 0xe000) == 0xc000) {
      (this_01->super_fme7_apu_state_t).latch = (uint8_t)data;
      return;
    }
  }
  if (this->vrc6 != (Nes_Vrc6_Apu *)0x0) {
    if ((addr & 0xfff) < 3 && addr - 0x9000 < 0x3000) {
      psVar1 = (this->super_Nes_Cpu).state;
      Nes_Vrc6_Apu::write_osc
                (this->vrc6,psVar1->base + psVar1->time,addr - 0x9000 >> 0xc,addr & 0xfff,data);
      return;
    }
  }
  return;
}

Assistant:

void Nsf_Emu::cpu_write_misc( nes_addr_t addr, int data )
{
	#if !NSF_EMU_APU_ONLY
	{
		if ( namco )
		{
			switch ( addr )
			{
			case Nes_Namco_Apu::data_reg_addr:
				namco->write_data( time(), data );
				return;
			
			case Nes_Namco_Apu::addr_reg_addr:
				namco->write_addr( data );
				return;
			}
		}
		
		if ( addr >= Nes_Fme7_Apu::latch_addr && fme7 )
		{
			switch ( addr & Nes_Fme7_Apu::addr_mask )
			{
			case Nes_Fme7_Apu::latch_addr:
				fme7->write_latch( data );
				return;
			
			case Nes_Fme7_Apu::data_addr:
				fme7->write_data( time(), data );
				return;
			}
		}
		
		if ( vrc6 )
		{
			unsigned reg = addr & (Nes_Vrc6_Apu::addr_step - 1);
			unsigned osc = unsigned (addr - Nes_Vrc6_Apu::base_addr) / Nes_Vrc6_Apu::addr_step;
			if ( osc < Nes_Vrc6_Apu::osc_count && reg < Nes_Vrc6_Apu::reg_count )
			{
				vrc6->write_osc( time(), osc, reg, data );
				return;
			}
		}
	}
	#endif
	
	// unmapped write
	
	#ifndef NDEBUG
	{
		// some games write to $8000 and $8001 repeatedly
		if ( addr == 0x8000 || addr == 0x8001 ) return;
		
		// probably namco sound mistakenly turned on in mck
		if ( addr == 0x4800 || addr == 0xF800 ) return;
		
		// memory mapper?
		if ( addr == 0xFFF8 ) return;
		
		debug_printf( "write_unmapped( 0x%04X, 0x%02X )\n", (unsigned) addr, (unsigned) data );
	}
	#endif
}